

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmat.c
# Opt level: O2

int32 tmat_chk_uppertri(tmat_t *tmat)

{
  int32 **ppiVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar3 = tmat->n_tmat;
  if (tmat->n_tmat < 1) {
    uVar3 = 0;
  }
  uVar5 = 0;
  do {
    if (uVar5 == uVar3) {
      return 0;
    }
    uVar2 = tmat->n_state;
    uVar6 = 0;
    if (0 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    lVar7 = 1;
    uVar4 = 0;
    while (uVar4 != uVar6) {
      lVar8 = lVar7;
      while ((int)lVar8 < (int)uVar2) {
        ppiVar1 = tmat->tp[uVar5] + lVar8;
        lVar8 = lVar8 + 1;
        if (-0x38000000 < (*ppiVar1)[uVar4]) {
          return -1;
        }
      }
      lVar7 = lVar7 + 1;
      uVar4 = uVar4 + 1;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int32
tmat_chk_uppertri(tmat_t * tmat)
{
    int32 i, src, dst;

    /* Check that each tmat is upper-triangular */
    for (i = 0; i < tmat->n_tmat; i++) {
        for (dst = 0; dst < tmat->n_state; dst++)
            for (src = dst + 1; src < tmat->n_state; src++)
                if (tmat->tp[i][src][dst] > S3_LOGPROB_ZERO)
                    return -1;
    }

    return 0;
}